

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O2

int mg_read_inner(mg_connection *conn,void *buf,size_t len)

{
  long lVar1;
  char *__nptr;
  int iVar2;
  int iVar3;
  uint64_t uVar4;
  ulong uVar5;
  uint64_t uVar6;
  size_t sVar7;
  ulong uVar8;
  size_t sVar9;
  size_t sVar10;
  size_t __n;
  double dVar11;
  
  lVar1 = conn->consumed_content;
  uVar5 = 0x7fffffffffffffff;
  if ((ulong)conn->content_len < 0x7fffffffffffffff) {
    uVar5 = conn->content_len;
  }
  sVar7 = uVar5 - lVar1;
  sVar10 = 0;
  if (sVar7 == 0 || (long)uVar5 < lVar1) goto LAB_0010d765;
  sVar9 = 0x7fffffff;
  if (len < 0x7fffffff) {
    sVar9 = len;
  }
  if ((long)sVar7 < (long)sVar9) {
    sVar9 = sVar7;
  }
  __n = (conn->data_len - lVar1) - (long)conn->request_len;
  if ((long)__n < 1) {
    __n = 0;
  }
  else {
    if ((long)sVar9 < (long)__n) {
      __n = sVar9;
    }
    memcpy(buf,conn->buf + lVar1 + conn->request_len,__n);
    sVar9 = sVar9 - __n;
    conn->consumed_content = conn->consumed_content + __n;
    buf = (void *)((long)buf + __n);
  }
  __nptr = conn->dom_ctx->config[0xb];
  if (__nptr == (char *)0x0) {
LAB_0010d669:
    dVar11 = strtod("30000",(char **)0x0);
    dVar11 = dVar11 / 1000.0;
  }
  else {
    iVar2 = atoi(__nptr);
    dVar11 = (double)iVar2 / 1000.0;
    if (dVar11 <= 0.0) goto LAB_0010d669;
  }
  uVar4 = mg_get_current_time_ns();
  uVar5 = (ulong)(dVar11 * 1000000000.0);
  uVar8 = 0;
  while( true ) {
    iVar2 = (int)uVar8;
    sVar10 = (size_t)iVar2;
    if ((int)sVar9 < 1) break;
    while( true ) {
      if (conn->phys_ctx->stop_flag != 0) goto LAB_0010d740;
      iVar3 = pull_inner((FILE *)conn,(mg_connection *)((long)buf + sVar10),
                         (char *)(sVar9 & 0xffffffff),(int)uVar8,dVar11);
      if (iVar3 != -1) break;
      if ((dVar11 < 0.0) ||
         (uVar6 = mg_get_current_time_ns(),
         ((long)(dVar11 * 1000000000.0 - 9.223372036854776e+18) & (long)uVar5 >> 0x3f | uVar5) <
         uVar6 - uVar4)) goto LAB_0010d740;
    }
    if (iVar3 == 0) break;
    if (iVar3 == -2) {
      if (iVar2 == 0) {
        sVar10 = 0xffffffffffffffff;
        goto LAB_0010d759;
      }
      break;
    }
    uVar8 = (ulong)(uint)(iVar2 + iVar3);
    sVar9 = (size_t)(uint)((int)sVar9 - iVar3);
  }
LAB_0010d740:
  if (iVar2 < 0) {
LAB_0010d759:
    if (0 < (long)__n) {
      sVar10 = __n;
    }
  }
  else {
    conn->consumed_content = conn->consumed_content + sVar10;
    sVar10 = sVar10 + __n;
  }
LAB_0010d765:
  return (int)sVar10;
}

Assistant:

static int
mg_read_inner(struct mg_connection *conn, void *buf, size_t len)
{
	int64_t content_len, n, buffered_len, nread;
	int64_t len64 =
	    (int64_t)((len > INT_MAX) ? INT_MAX : len); /* since the return value is
	                                                 * int, we may not read more
	                                                 * bytes */
	const char *body;

	if (conn == NULL) {
		return 0;
	}

	/* If Content-Length is not set for a response with body data,
	 * we do not know in advance how much data should be read. */
	content_len = conn->content_len;
	if (content_len < 0) {
		/* The body data is completed when the connection is closed. */
		content_len = INT64_MAX;
	}

	nread = 0;
	if (conn->consumed_content < content_len) {
		/* Adjust number of bytes to read. */
		int64_t left_to_read = content_len - conn->consumed_content;
		if (left_to_read < len64) {
			/* Do not read more than the total content length of the
			 * request.
			 */
			len64 = left_to_read;
		}

		/* Return buffered data */
		buffered_len = (int64_t)(conn->data_len) - (int64_t)conn->request_len
		               - conn->consumed_content;
		if (buffered_len > 0) {
			if (len64 < buffered_len) {
				buffered_len = len64;
			}
			body = conn->buf + conn->request_len + conn->consumed_content;
			memcpy(buf, body, (size_t)buffered_len);
			len64 -= buffered_len;
			conn->consumed_content += buffered_len;
			nread += buffered_len;
			buf = (char *)buf + buffered_len;
		}

		/* We have returned all buffered data. Read new data from the remote
		 * socket.
		 */
		if ((n = pull_all(NULL, conn, (char *)buf, (int)len64)) >= 0) {
			conn->consumed_content += n;
			nread += n;
		} else {
			nread = ((nread > 0) ? nread : n);
		}
	}
	return (int)nread;
}